

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execBcc<(moira::Core)2,(moira::Instr)12,(moira::Mode)12,4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  PrefetchQueue PVar2;
  
  this->cp = 0;
  if ((this->reg).sr.c == false) {
    uVar1 = (this->reg).pc;
    PVar2 = this->queue;
    readExt<(moira::Core)2>(this);
    (this->reg).pc = ((uint)(this->queue).irc | (int)PVar2 << 0x10) + uVar1;
    fullPrefetch<(moira::Core)2,4ull,0>(this);
  }
  else {
    readExt<(moira::Core)2>(this);
    readExt<(moira::Core)2>(this);
    prefetch<(moira::Core)2,4ull>(this);
  }
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 6));
  return;
}

Assistant:

void
Moira::execBcc(u16 opcode)
{
    AVAILABILITY(S == Long ? Core::C68020 : Core::C68000)

    u32 oldpc = reg.pc;

    SYNC(2);

    if (cond<I>()) {

        u32 disp = S == Byte ? (u8)opcode : queue.irc;

        if (S == Long) {

            readExt<C>();
            disp = disp << 16 | queue.irc;
        }

        u32 newpc = U32_ADD(oldpc, SEXT<S>(disp));

        // Check for address error
        if (misaligned<C>(newpc)) {
            throw AddressError(makeFrame(newpc));
        }

        // Take branch
        reg.pc = newpc;
        fullPrefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_IP   (10, 10,  6,       10, 10,  6,        0,  0,  6)

    } else {

        // Fall through to next instruction
        if constexpr (C == Core::C68000) SYNC(2);
        if constexpr (S == Word || S == Long) readExt<C>();
        if constexpr (S == Long) readExt<C>();
        prefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_IP   ( 8,  6,  4,       12, 10,  6,        0,  0,  6)
    }

    FINALIZE
}